

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

char * parse_text(char *data,char delim,uint *len)

{
  uint uVar1;
  char cVar2;
  ushort uVar3;
  ushort *puVar4;
  bool bVar5;
  int iVar6;
  ushort **ppuVar7;
  LY_ERR *pLVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int32_t value;
  uint uVar13;
  char local_458 [8];
  char buf [1024];
  char *local_40;
  
  *len = 0;
  uVar11 = 0;
  local_40 = (char *)0x0;
  uVar13 = 0;
  uVar12 = 0;
  bVar5 = false;
LAB_0012010a:
  cVar2 = data[uVar11];
  if (bVar5) {
LAB_00120117:
    if (cVar2 == '\0') {
LAB_00120465:
      pcVar10 = "element content, \"]]>\" found";
      goto LAB_0012046c;
    }
  }
  else {
    pcVar10 = data + uVar11;
    if (cVar2 != delim) {
      if (cVar2 != ']') goto LAB_00120117;
      if ((pcVar10[1] != ']') || (pcVar10[2] != '>')) goto LAB_00120166;
      goto LAB_00120465;
    }
    if ((delim != '<') || (iVar6 = strncmp(pcVar10,"<![CDATA[",9), iVar6 != 0)) {
      if (uVar13 == 0) {
        if (local_40 == (char *)0x0) {
          pcVar10 = strdup("");
          return pcVar10;
        }
LAB_00120504:
        local_40[(int)uVar12] = '\0';
        return local_40;
      }
      if (local_40 == (char *)0x0) {
        local_40 = (char *)malloc((long)(int)(uVar13 + 1));
        uVar12 = uVar13;
      }
      else {
        local_40 = (char *)realloc(local_40,(long)(int)(uVar12 + uVar13 + 1));
        uVar12 = uVar12 + uVar13;
      }
      if (local_40 != (char *)0x0) {
        memcpy(local_40 + (int)(uVar12 - uVar13),local_458,(long)(int)uVar13);
        goto LAB_00120504;
      }
      goto LAB_0012050e;
    }
  }
LAB_00120166:
  if (0x3fc < (int)uVar13) {
    if (local_40 == (char *)0x0) {
      local_40 = (char *)malloc((ulong)(uVar13 + 1));
      uVar12 = uVar13;
    }
    else {
      local_40 = (char *)ly_realloc(local_40,(ulong)(uVar12 + uVar13 + 1));
      uVar12 = uVar12 + uVar13;
    }
    if (local_40 == (char *)0x0) {
LAB_0012050e:
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","parse_text");
      return (char *)0x0;
    }
    memcpy(local_40 + (int)(uVar12 - uVar13),local_458,(ulong)uVar13);
    uVar11 = *len;
    uVar13 = 0;
  }
  if (bVar5) {
LAB_001201df:
    if (((data[uVar11] == ']') && (data[(ulong)uVar11 + 1] == ']')) &&
       (data[(ulong)uVar11 + 2] == '>')) {
      uVar11 = uVar11 + 3;
      *len = uVar11;
      uVar13 = uVar13 - 1;
      bVar5 = false;
    }
    else {
      local_458[(int)uVar13] = data[uVar11];
      uVar11 = uVar11 + 1;
      *len = uVar11;
      bVar5 = true;
    }
    goto LAB_0012045d;
  }
  pcVar10 = data + uVar11;
  iVar6 = strncmp(pcVar10,"<![CDATA[",9);
  if (iVar6 == 0) {
    uVar11 = uVar11 + 9;
    *len = uVar11;
    goto LAB_001201df;
  }
  if (*pcVar10 == '&') {
    uVar1 = uVar11 + 1;
    *len = uVar1;
    cVar2 = data[uVar1];
    if (cVar2 == '#') {
      uVar1 = uVar11 + 2;
      *len = uVar1;
      ppuVar7 = __ctype_b_loc();
      puVar4 = *ppuVar7;
      lVar9 = (long)data[uVar1];
      uVar3 = puVar4[lVar9];
      if ((uVar3 >> 0xb & 1) == 0) {
        *len = uVar11 + 3;
        if (data[uVar1] == 'x') {
          lVar9 = (long)data[uVar11 + 3];
          uVar3 = puVar4[lVar9];
          if ((uVar3 >> 0xc & 1) != 0) {
            uVar11 = uVar11 + 4;
            value = 0;
            while ((uVar3 >> 0xc & 1) != 0) {
              iVar6 = (uint)((char)lVar9 < 'G') * 0x20 + -0x57;
              if ((uVar3 >> 0xb & 1) != 0) {
                iVar6 = -0x30;
              }
              value = value * 0x10 + (int)(char)lVar9 + iVar6;
              *len = uVar11;
              lVar9 = (long)data[uVar11];
              uVar11 = uVar11 + 1;
              uVar3 = puVar4[lVar9];
            }
            goto LAB_0012042b;
          }
        }
        pcVar10 = "character reference";
        goto LAB_0012046c;
      }
      uVar11 = uVar11 + 3;
      value = 0;
      while ((uVar3 >> 0xb & 1) != 0) {
        value = value * 10 + (int)(char)lVar9 + -0x30;
        *len = uVar11;
        lVar9 = (long)data[uVar11];
        uVar11 = uVar11 + 1;
        uVar3 = puVar4[lVar9];
      }
      if ((char)lVar9 != ';') {
        pcVar10 = "character reference, missing semicolon";
        goto LAB_0012046c;
      }
LAB_0012042b:
      uVar11 = pututf8(local_458 + (int)uVar13,value);
      if (uVar11 == 0) {
        pcVar10 = "character reference value";
LAB_0012046c:
        ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar10);
LAB_0012047a:
        free(local_40);
        return (char *)0x0;
      }
      uVar13 = (uVar13 + uVar11) - 1;
      uVar11 = *len + 1;
    }
    else {
      pcVar10 = data + uVar1;
      if (cVar2 == 'g') {
        if ((pcVar10[1] != 't') || (pcVar10[2] != ';')) goto LAB_001202e0;
        local_458[(int)uVar13] = '>';
      }
      else {
        if (((cVar2 != 'l') || (pcVar10[1] != 't')) || (pcVar10[2] != ';')) {
LAB_001202e0:
          iVar6 = strncmp(pcVar10,"amp;",4);
          if (iVar6 == 0) {
            local_458[(int)uVar13] = '&';
            uVar11 = uVar11 + 5;
            goto LAB_00120451;
          }
          iVar6 = strncmp(pcVar10,"apos;",5);
          if (iVar6 == 0) {
            local_458[(int)uVar13] = '\'';
          }
          else {
            iVar6 = strncmp(pcVar10,"quot;",5);
            if (iVar6 != 0) {
              pcVar10 = "entity reference (only predefined references are supported)";
              goto LAB_0012046c;
            }
            local_458[(int)uVar13] = '\"';
          }
          uVar11 = uVar11 + 6;
          goto LAB_00120451;
        }
        local_458[(int)uVar13] = '<';
      }
      uVar11 = uVar11 + 4;
    }
  }
  else {
    uVar11 = copyutf8(local_458 + (int)uVar13,pcVar10);
    if (uVar11 == 0) goto LAB_0012047a;
    uVar13 = (uVar13 + uVar11) - 1;
    uVar11 = *len + uVar11;
  }
LAB_00120451:
  *len = uVar11;
  bVar5 = false;
LAB_0012045d:
  uVar13 = uVar13 + 1;
  goto LAB_0012010a;
}

Assistant:

static char *
parse_text(const char *data, char delim, unsigned int *len)
{
#define BUFSIZE 1024

    char buf[BUFSIZE];
    char *result = NULL, *aux;
    unsigned int r;
    int o, size = 0;
    int cdsect = 0;
    int32_t n;

    for (*len = o = 0; cdsect || data[*len] != delim; o++) {
        if (!data[*len] || (!cdsect && !strncmp(&data[*len], "]]>", 3))) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "element content, \"]]>\" found");
            goto error;
        }

loop:

        if (o > BUFSIZE - 4) {
            /* add buffer into the result */
            if (result) {
                size = size + o;
                aux = ly_realloc(result, size + 1);
                result = aux;
            } else {
                size = o;
                result = malloc((size + 1) * sizeof *result);
            }
            if (!result) {
                LOGMEM;
                return NULL;
            }
            memcpy(&result[size - o], buf, o);

            /* write again into the beginning of the buffer */
            o = 0;
        }

        if (cdsect || !strncmp(&data[*len], "<![CDATA[", 9)) {
            /* CDSect */
            if (!cdsect) {
                cdsect = 1;
                *len += 9;
            }
            if (data[*len] && !strncmp(&data[*len], "]]>", 3)) {
                *len += 3;
                cdsect = 0;
                o--;            /* we don't write any data in this iteration */
            } else {
                buf[o] = data[*len];
                (*len)++;
            }
        } else if (data[*len] == '&') {
            (*len)++;
            if (data[*len] != '#') {
                /* entity reference - only predefined refs are supported */
                if (!strncmp(&data[*len], "lt;", 3)) {
                    buf[o] = '<';
                    *len += 3;
                } else if (!strncmp(&data[*len], "gt;", 3)) {
                    buf[o] = '>';
                    *len += 3;
                } else if (!strncmp(&data[*len], "amp;", 4)) {
                    buf[o] = '&';
                    *len += 4;
                } else if (!strncmp(&data[*len], "apos;", 5)) {
                    buf[o] = '\'';
                    *len += 5;
                } else if (!strncmp(&data[*len], "quot;", 5)) {
                    buf[o] = '\"';
                    *len += 5;
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "entity reference (only predefined references are supported)");
                    goto error;
                }
            } else {
                /* character reference */
                (*len)++;
                if (isdigit(data[*len])) {
                    for (n = 0; isdigit(data[*len]); (*len)++) {
                        n = (10 * n) + (data[*len] - '0');
                    }
                    if (data[*len] != ';') {
                        LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference, missing semicolon");
                        goto error;
                    }
                } else if (data[(*len)++] == 'x' && isxdigit(data[*len])) {
                    for (n = 0; isxdigit(data[*len]); (*len)++) {
                        if (isdigit(data[*len])) {
                            r = (data[*len] - '0');
                        } else if (data[*len] > 'F') {
                            r = 10 + (data[*len] - 'a');
                        } else {
                            r = 10 + (data[*len] - 'A');
                        }
                        n = (16 * n) + r;
                    }
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference");
                    goto error;

                }
                r = pututf8(&buf[o], n);
                if (!r) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference value");
                    goto error;
                }
                o += r - 1;     /* o is ++ in for loop */
                (*len)++;
            }
        } else {
            r = copyutf8(&buf[o], &data[*len]);
            if (!r) {
                goto error;
            }

            o += r - 1;     /* o is ++ in for loop */
            (*len) = (*len) + r;
        }
    }

    if (delim == '<' && !strncmp(&data[*len], "<![CDATA[", 9)) {
        /* ignore loop's end condition on beginning of CDSect */
        goto loop;
    }
#undef BUFSIZE

    if (o) {
        if (result) {
            size = size + o;
            aux = realloc(result, size + 1);
            result = aux;
        } else {
            size = o;
            result = malloc((size + 1) * sizeof *result);
        }
        if (!result) {
            LOGMEM;
            return NULL;
        }
        memcpy(&result[size - o], buf, o);
    }
    if (result) {
        result[size] = '\0';
    } else {
        size = 0;
        result = strdup("");
    }

    return result;

error:
    free(result);
    return NULL;
}